

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

void __thiscall llvm::yaml::MappingNode::increment(MappingNode *this)

{
  pointer pcVar1;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar2;
  TokenKind TVar3;
  iterator Position;
  Token *pTVar4;
  KeyValueNode *pKVar5;
  char *pcVar6;
  Scanner *this_00;
  Token T;
  long *local_100 [2];
  long local_f0 [3];
  Twine local_d8;
  Token local_c0;
  Token local_88;
  Token local_50;
  
  this_00 = *(Scanner **)
             &((((this->super_Node).Doc)->_M_t).
               super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
               .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream->scanner;
  if (this_00->Failed == true) {
LAB_001cfa27:
    this->IsAtEnd = true;
    this->CurrentEntry = (KeyValueNode *)0x0;
    return;
  }
  if (this->CurrentEntry != (KeyValueNode *)0x0) {
    KeyValueNode::skip(this->CurrentEntry);
    if (this->Type == MT_Inline) goto LAB_001cfa27;
    this_00 = *(Scanner **)
               &((((this->super_Node).Doc)->_M_t).
                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream->
                scanner;
  }
  pTVar4 = Scanner::peekNext(this_00);
  TVar3 = pTVar4->Kind;
  Position = (pTVar4->Range).Data;
  pcVar1 = (pTVar4->Value)._M_dataplus._M_p;
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_100,pcVar1,pcVar1 + (pTVar4->Value)._M_string_length);
  if ((TVar3 & ~TK_StreamEnd) == TK_Key) {
    pKVar5 = (KeyValueNode *)
             BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                       (&((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         NodeAllocator,0x58,0x10);
    puVar2 = (this->super_Node).Doc;
    (pKVar5->super_Node).Doc = puVar2;
    (pKVar5->super_Node).TypeID = 3;
    (pKVar5->super_Node).Tag.Data = (char *)0x0;
    (pKVar5->super_Node).Tag.Length = 0;
    (pKVar5->super_Node).Anchor.Data = (char *)0x0;
    (pKVar5->super_Node).Anchor.Length = 0;
    pTVar4 = Scanner::peekNext(*(Scanner **)
                                &((puVar2->_M_t).
                                  super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                  .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl
                                 )->stream->scanner);
    pcVar6 = (pTVar4->Range).Data;
    (pKVar5->super_Node).SourceRange.Start.Ptr = pcVar6;
    (pKVar5->super_Node).SourceRange.End.Ptr = pcVar6;
    (pKVar5->super_Node)._vptr_Node = (_func_int **)&PTR_anchor_0023d5a8;
    pKVar5->Key = (Node *)0x0;
    pKVar5->Value = (Node *)0x0;
    this->CurrentEntry = pKVar5;
    goto LAB_001cfc28;
  }
  if (this->Type == MT_Block) {
    if (TVar3 != TK_Error) {
      if (TVar3 != TK_BlockEnd) {
        pcVar6 = "Unexpected token. Expected Key or Block End";
        goto LAB_001cfbf5;
      }
      Scanner::getNext(&local_50,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50.Value._M_dataplus._M_p != &local_50.Value.field_2) goto LAB_001cfbdb;
    }
  }
  else if (TVar3 != TK_Error) {
    if (TVar3 == TK_FlowMappingEnd) {
      Scanner::getNext(&local_c0,
                       *(Scanner **)
                        &((((this->super_Node).Doc)->_M_t).
                          super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                          .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                         stream->scanner);
      local_50.Value.field_2._M_allocated_capacity = local_c0.Value.field_2._M_allocated_capacity;
      local_50.Value._M_dataplus._M_p = local_c0.Value._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.Value._M_dataplus._M_p != &local_c0.Value.field_2) {
LAB_001cfbdb:
        operator_delete(local_50.Value._M_dataplus._M_p,
                        local_50.Value.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if (TVar3 == TK_FlowEntry) {
        Scanner::getNext(&local_88,
                         *(Scanner **)
                          &((((this->super_Node).Doc)->_M_t).
                            super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                            .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                           stream->scanner);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88.Value._M_dataplus._M_p != &local_88.Value.field_2) {
          operator_delete(local_88.Value._M_dataplus._M_p,
                          local_88.Value.field_2._M_allocated_capacity + 1);
        }
        increment(this);
        goto LAB_001cfc28;
      }
      pcVar6 = "Unexpected token. Expected Key, Flow Entry, or Flow Mapping End.";
LAB_001cfbf5:
      Twine::Twine(&local_d8,pcVar6);
      Scanner::setError(*(Scanner **)
                         &((((this->super_Node).Doc)->_M_t).
                           super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                           .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->
                          stream->scanner,&local_d8,Position);
    }
  }
  this->IsAtEnd = true;
  this->CurrentEntry = (KeyValueNode *)0x0;
LAB_001cfc28:
  if (local_100[0] != local_f0) {
    operator_delete(local_100[0],local_f0[0] + 1);
  }
  return;
}

Assistant:

void MappingNode::increment() {
  if (failed()) {
    IsAtEnd = true;
    CurrentEntry = nullptr;
    return;
  }
  if (CurrentEntry) {
    CurrentEntry->skip();
    if (Type == MT_Inline) {
      IsAtEnd = true;
      CurrentEntry = nullptr;
      return;
    }
  }
  Token T = peekNext();
  if (T.Kind == Token::TK_Key || T.Kind == Token::TK_Scalar) {
    // KeyValueNode eats the TK_Key. That way it can detect null keys.
    CurrentEntry = new (getAllocator()) KeyValueNode(Doc);
  } else if (Type == MT_Block) {
    switch (T.Kind) {
    case Token::TK_BlockEnd:
      getNext();
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError("Unexpected token. Expected Key or Block End", T);
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  } else {
    switch (T.Kind) {
    case Token::TK_FlowEntry:
      // Eat the flow entry and recurse.
      getNext();
      return increment();
    case Token::TK_FlowMappingEnd:
      getNext();
      LLVM_FALLTHROUGH;
    case Token::TK_Error:
      // Set this to end iterator.
      IsAtEnd = true;
      CurrentEntry = nullptr;
      break;
    default:
      setError( "Unexpected token. Expected Key, Flow Entry, or Flow "
                "Mapping End."
              , T);
      IsAtEnd = true;
      CurrentEntry = nullptr;
    }
  }
}